

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5PoslistOffsetsCallback(Fts5Index *pUnused,void *pContext,u8 *pChunk,int nChunk)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int in_ECX;
  long *in_RSI;
  long in_FS_OFFSET;
  int i;
  PoslistOffsetsCtx *pCtx;
  int iVal;
  uchar *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < in_ECX) {
    iVar4 = 0;
    while (iVar4 < in_ECX) {
      iVar2 = sqlite3Fts5GetVarint32
                        ((uchar *)in_RSI,(u32 *)CONCAT44(iVar4,in_stack_ffffffffffffffc0));
      iVar4 = iVar2 + iVar4;
      iVar2 = (int)in_RSI[2] + -0x55555558;
      *(int *)(in_RSI + 2) = iVar2;
      iVar3 = fts5IndexColsetTest((Fts5Colset *)in_RSI[1],iVar2);
      if (iVar3 != 0) {
        iVar3 = sqlite3Fts5PutVarint(in_stack_ffffffffffffffb8,0x2821b2);
        *(int *)(*in_RSI + 8) = iVar3 + *(int *)(*in_RSI + 8);
        *(int *)((long)in_RSI + 0x14) = iVar2;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fts5PoslistOffsetsCallback(
  Fts5Index *pUnused,
  void *pContext,
  const u8 *pChunk, int nChunk
){
  PoslistOffsetsCtx *pCtx = (PoslistOffsetsCtx*)pContext;
  UNUSED_PARAM(pUnused);
  assert_nc( nChunk>=0 );
  if( nChunk>0 ){
    int i = 0;
    while( i<nChunk ){
      int iVal;
      i += fts5GetVarint32(&pChunk[i], iVal);
      iVal += pCtx->iRead - 2;
      pCtx->iRead = iVal;
      if( fts5IndexColsetTest(pCtx->pColset, iVal) ){
        fts5BufferSafeAppendVarint(pCtx->pBuf, iVal + 2 - pCtx->iWrite);
        pCtx->iWrite = iVal;
      }
    }
  }
}